

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

mfcc_t *** feat_array_alloc(feat_t *fcb,int32 nfr)

{
  mfcc_t ***pppmVar1;
  void *pvVar2;
  uint32 local_54;
  uint32 local_50;
  int local_4c;
  int local_44;
  mfcc_t ***feat;
  mfcc_t *d;
  mfcc_t *data;
  int32 k;
  int32 j;
  int32 i;
  int32 nfr_local;
  feat_t *fcb_local;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x169,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (nfr < 1) {
    __assert_fail("nfr > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x16a,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (fcb->out_dim == 0) {
    __assert_fail("feat_dimension(fcb) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x16b,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  data._0_4_ = 0;
  for (k = 0; k < fcb->n_stream; k = k + 1) {
    data._0_4_ = fcb->stream_len[k] + (uint)data;
  }
  if (fcb->out_dim <= (uint)data) {
    if (fcb->sv_dim <= (int)(uint)data) {
      if (fcb->n_sv == 0) {
        local_44 = fcb->n_stream;
      }
      else {
        local_44 = fcb->n_sv;
      }
      pppmVar1 = (mfcc_t ***)
                 __ckd_calloc_2d__((long)nfr,(long)local_44,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                   ,0x176);
      pvVar2 = __ckd_calloc__((long)(int)(nfr * (uint)data),4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                              ,0x177);
      for (k = 0; k < nfr; k = k + 1) {
        feat = (mfcc_t ***)((long)pvVar2 + (long)(int)(k * (uint)data) * 4);
        data._4_4_ = 0;
        while( true ) {
          if (fcb->n_sv == 0) {
            local_4c = fcb->n_stream;
          }
          else {
            local_4c = fcb->n_sv;
          }
          if (local_4c <= data._4_4_) break;
          pppmVar1[k][data._4_4_] = (mfcc_t *)feat;
          if (fcb->lda == (mfcc_t ***)0x0) {
            if (fcb->sv_len == (uint32 *)0x0) {
              local_54 = fcb->stream_len[data._4_4_];
            }
            else {
              local_54 = fcb->sv_len[data._4_4_];
            }
            local_50 = local_54;
          }
          else {
            local_50 = fcb->out_dim;
          }
          feat = (mfcc_t ***)((long)feat + (ulong)local_50 * 4);
          data._4_4_ = data._4_4_ + 1;
        }
      }
      return pppmVar1;
    }
    __assert_fail("k >= fcb->sv_dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x173,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  __assert_fail("k >= feat_dimension(fcb)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x172,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
}

Assistant:

mfcc_t ***
feat_array_alloc(feat_t * fcb, int32 nfr)
{
    int32 i, j, k;
    mfcc_t *data, *d, ***feat;

    assert(fcb);
    assert(nfr > 0);
    assert(feat_dimension(fcb) > 0);

    /* Make sure to use the dimensionality of the features *before*
       LDA and subvector projection. */
    k = 0;
    for (i = 0; i < fcb->n_stream; ++i)
        k += fcb->stream_len[i];
    assert(k >= feat_dimension(fcb));
    assert(k >= fcb->sv_dim);

    feat =
        (mfcc_t ***) ckd_calloc_2d(nfr, feat_dimension1(fcb), sizeof(mfcc_t *));
    data = (mfcc_t *) ckd_calloc(nfr * k, sizeof(mfcc_t));

    for (i = 0; i < nfr; i++) {
        d = data + i * k;
        for (j = 0; j < feat_dimension1(fcb); j++) {
            feat[i][j] = d;
            d += feat_dimension2(fcb, j);
        }
    }

    return feat;
}